

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::BasicTexImageCubeCase::createTexture(BasicTexImageCubeCase *this)

{
  ContextWrapper *this_00;
  float fVar1;
  float fVar2;
  deUint32 format;
  deUint32 type;
  int i;
  uint uVar3;
  deUint32 dVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int ndx;
  float fVar10;
  uint local_100;
  deUint32 tex;
  long local_f0;
  int local_e8;
  int local_e4;
  ulong local_e0;
  Vec4 gMax;
  TextureFormat fmt;
  Vec4 gMin;
  PixelBufferAccess local_a8;
  TextureLevel levelData;
  float afStack_50 [4];
  Random rnd;
  
  fmt = (this->super_TextureSpecCase).m_texFormat;
  local_100 = 1;
  if (((this->super_TextureSpecCase).m_flags & 1) != 0) {
    uVar6 = (this->super_TextureSpecCase).m_width;
    uVar3 = 0x20;
    uVar8 = 0x20;
    if (uVar6 != 0) {
      uVar8 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      uVar8 = uVar8 ^ 0x1f;
    }
    uVar6 = (this->super_TextureSpecCase).m_height;
    if (uVar6 != 0) {
      uVar3 = 0x1f;
      if (uVar6 != 0) {
        for (; uVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    iVar9 = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar8)) {
      iVar9 = 0x1f - uVar8;
    }
    local_100 = iVar9 + 1;
  }
  tex = 0;
  tcu::TextureLevel::TextureLevel(&levelData,&fmt);
  dVar4 = deStringHash((this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode.
                       m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  this_00 = &(this->super_TextureSpecCase).super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0x8513,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  if (0 < (int)local_100) {
    uVar7 = 0;
    lVar5 = local_f0;
    do {
      local_f0 = lVar5;
      local_e4 = (this->super_TextureSpecCase).m_width >> ((byte)uVar7 & 0x1f);
      if (local_e4 < 2) {
        local_e4 = 1;
      }
      local_e8 = (this->super_TextureSpecCase).m_height >> ((byte)uVar7 & 0x1f);
      if (local_e8 < 2) {
        local_e8 = 1;
      }
      local_e0 = uVar7;
      tcu::TextureLevel::setSize(&levelData,local_e4,local_e8,1);
      local_f0 = 0;
      do {
        local_a8.super_ConstPixelBufferAccess.m_format.order = R;
        local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        lVar5 = 0;
        do {
          gMax.m_data[lVar5] = 1.0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        gMin.m_data[0] = 0.0;
        gMin.m_data[1] = 0.0;
        gMin.m_data[2] = 0.0;
        gMin.m_data[3] = 0.0;
        lVar5 = 0;
        do {
          fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar5 + -2];
          fVar2 = gMax.m_data[lVar5];
          fVar10 = deRandom_getFloat(&rnd.m_rnd);
          gMin.m_data[lVar5] = (fVar2 - fVar1) * fVar10 + fVar1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        local_a8.super_ConstPixelBufferAccess.m_format.order = R;
        local_a8.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
        local_a8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0;
        lVar5 = 0;
        do {
          afStack_50[lVar5] = 1.0;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        gMax.m_data[0] = 0.0;
        gMax.m_data[1] = 0.0;
        gMax.m_data[2] = 0.0;
        gMax.m_data[3] = 0.0;
        lVar5 = 0;
        do {
          fVar1 = (float)local_a8.super_ConstPixelBufferAccess.m_size.m_data[lVar5 + -2];
          fVar2 = afStack_50[lVar5];
          fVar10 = deRandom_getFloat(&rnd.m_rnd);
          gMax.m_data[lVar5] = (fVar2 - fVar1) * fVar10 + fVar1;
          lVar5 = lVar5 + 1;
        } while (lVar5 != 4);
        tcu::TextureLevel::getAccess(&local_a8,&levelData);
        tcu::fillWithComponentGradients(&local_a8,&gMin,&gMax);
        dVar4 = (&s_cubeMapFaces)[local_f0];
        format = this->m_format;
        type = this->m_dataType;
        tcu::TextureLevel::getAccess(&local_a8,&levelData);
        sglr::ContextWrapper::glTexImage2D
                  (this_00,dVar4,(int)local_e0,format,local_e4,local_e8,0,format,type,
                   local_a8.super_ConstPixelBufferAccess.m_data);
        local_f0 = local_f0 + 1;
      } while (local_f0 != 6);
      uVar6 = (int)local_e0 + 1;
      uVar7 = (ulong)uVar6;
      local_f0 = 6;
      lVar5 = 6;
    } while (uVar6 != local_100);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		tcu::TextureFormat	fmt			= m_texFormat;
		int					numLevels	= (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(fmt);
		de::Random			rnd			(deStringHash(getName()));

		DE_ASSERT(m_width == m_height); // Non-square cubemaps are not supported by GLES2.

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			levelData.setSize(levelW, levelH);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd);
				Vec4 gMax = randomVector<4>(rnd);

				tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

				glTexImage2D(s_cubeMapFaces[face], ndx, m_format, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
			}
		}
	}